

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Joint::unkeyframe(Joint *this,double t)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  pointer ppJVar3;
  bool bVar4;
  bool bVar5;
  iterator iVar6;
  _Self __tmp;
  _Rb_tree_node_base *p_Var7;
  pointer ppJVar8;
  double dVar9;
  double dVar10;
  
  if ((this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      0) {
    p_Var1 = &(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5 && bVar4]) {
      bVar4 = t != *(double *)(p_Var2 + 1);
      bVar5 = *(double *)(p_Var2 + 1) <= t;
      if (!bVar5 || !bVar4) {
        p_Var7 = p_Var2;
      }
    }
    iVar6._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var7);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      p_Var7 = iVar6._M_node;
    }
    dVar10 = ABS(*(double *)(iVar6._M_node + 1) - t);
    dVar9 = ABS(*(double *)(p_Var7 + 1) - t);
    if (((dVar10 < 0.1) && (dVar10 < dVar9)) ||
       ((dVar9 < 0.1 && (iVar6._M_node = p_Var7, dVar9 < dVar10)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).positions,iVar6);
    }
  }
  if ((this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      0) {
    p_Var1 = &(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5 && bVar4]) {
      bVar4 = t != *(double *)(p_Var2 + 1);
      bVar5 = *(double *)(p_Var2 + 1) <= t;
      if (!bVar5 || !bVar4) {
        p_Var7 = p_Var2;
      }
    }
    iVar6._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var7);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      p_Var7 = iVar6._M_node;
    }
    dVar10 = ABS(*(double *)(iVar6._M_node + 1) - t);
    dVar9 = ABS(*(double *)(p_Var7 + 1) - t);
    if (((dVar10 < 0.1) && (dVar10 < dVar9)) ||
       ((dVar9 < 0.1 && (iVar6._M_node = p_Var7, dVar9 < dVar10)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).rotations,iVar6);
    }
  }
  if ((this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
  {
    p_Var1 = &(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5 && bVar4]) {
      bVar4 = t != *(double *)(p_Var2 + 1);
      bVar5 = *(double *)(p_Var2 + 1) <= t;
      if (!bVar5 || !bVar4) {
        p_Var7 = p_Var2;
      }
    }
    iVar6._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var7);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      p_Var7 = iVar6._M_node;
    }
    dVar10 = ABS(*(double *)(iVar6._M_node + 1) - t);
    dVar9 = ABS(*(double *)(p_Var7 + 1) - t);
    if (((dVar10 < 0.1) && (dVar10 < dVar9)) ||
       ((dVar9 < 0.1 && (iVar6._M_node = p_Var7, dVar9 < dVar10)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).scales,iVar6);
    }
  }
  ppJVar3 = (this->kids).
            super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar8 = (this->kids).
                 super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar8 != ppJVar3;
      ppJVar8 = ppJVar8 + 1) {
    unkeyframe(*ppJVar8,t);
  }
  return;
}

Assistant:

void Joint::unkeyframe(double t) {
     positions.removeKnot(t, 0.1);
     rotations.removeKnot(t, 0.1);
     scales.removeKnot(t, 0.1);
     for (Joint *j : kids) j->unkeyframe(t);
   }